

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_rawget(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectType SVar1;
  bool bVar2;
  SQObjectPtr *key;
  SQObjectPtr *val;
  SQRESULT SVar3;
  SQClass *in_RSI;
  SQObjectPtr *obj;
  SQObjectPtr *self;
  SQChar *in_stack_ffffffffffffffb8;
  SQVM *in_stack_ffffffffffffffc0;
  
  key = stack_get(in_stack_ffffffffffffffc0,(SQInteger)in_stack_ffffffffffffffb8);
  val = SQVM::GetUp(in_stack_ffffffffffffffc0,(SQInteger)in_stack_ffffffffffffffb8);
  SVar1 = (key->super_SQObject)._type;
  if (SVar1 == OT_ARRAY) {
    if (((val->super_SQObject)._type & 0x4000000) == 0) {
      SQVM::Pop((SQVM *)0x10b1aa);
      SVar3 = sq_throwerror(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      return SVar3;
    }
    if ((val->super_SQObject)._type == OT_FLOAT) {
      in_stack_ffffffffffffffc0 = (SQVM *)(long)(val->super_SQObject)._unVal.fFloat;
    }
    else {
      in_stack_ffffffffffffffc0 = (SQVM *)(val->super_SQObject)._unVal.pTable;
    }
    bVar2 = SQArray::Get((SQArray *)in_RSI,(SQInteger)key,val);
    if (bVar2) {
      return 0;
    }
  }
  else if (SVar1 == OT_CLASS) {
    bVar2 = SQClass::Get(in_RSI,key,val);
    if (bVar2) {
      return 0;
    }
  }
  else if (SVar1 == OT_TABLE) {
    bVar2 = SQTable::Get((SQTable *)in_RSI,key,val);
    if (bVar2) {
      return 0;
    }
  }
  else {
    if (SVar1 != OT_INSTANCE) {
      SQVM::Pop((SQVM *)0x10b1ce);
      SVar3 = sq_throwerror(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      return SVar3;
    }
    bVar2 = SQInstance::Get((SQInstance *)in_RSI,key,val);
    if (bVar2) {
      return 0;
    }
  }
  SQVM::Pop((SQVM *)0x10b1f0);
  SVar3 = sq_throwerror(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return SVar3;
}

Assistant:

SQRESULT sq_rawget(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &self=stack_get(v,idx);
    SQObjectPtr &obj = v->GetUp(-1);
    switch(sq_type(self)) {
    case OT_TABLE:
        if(_table(self)->Get(obj,obj))
            return SQ_OK;
        break;
    case OT_CLASS:
        if(_class(self)->Get(obj,obj))
            return SQ_OK;
        break;
    case OT_INSTANCE:
        if(_instance(self)->Get(obj,obj))
            return SQ_OK;
        break;
    case OT_ARRAY:{
        if(sq_isnumeric(obj)){
            if(_array(self)->Get(tointeger(obj),obj)) {
                return SQ_OK;
            }
        }
        else {
            v->Pop();
            return sq_throwerror(v,_SC("invalid index type for an array"));
        }
                  }
        break;
    default:
        v->Pop();
        return sq_throwerror(v,_SC("rawget works only on array/table/instance and class"));
    }
    v->Pop();
    return sq_throwerror(v,_SC("the index doesn't exist"));
}